

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

string * __thiscall
ylt::metric::manager_helper::serialize_abi_cxx11_
          (string *__return_storage_ptr__,manager_helper *this,
          vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
          *metrics)

{
  undefined8 *puVar1;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  *extraout_RDX;
  shared_ptr<ylt::metric::metric_t> *m;
  undefined8 *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(undefined8 **)(this + 8);
  for (puVar2 = *(undefined8 **)this; puVar2 != puVar1; puVar2 = puVar2 + 2) {
    (**(code **)(*(long *)*puVar2 + 0x38))((long *)*puVar2,__return_storage_ptr__,metrics);
    metrics = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string serialize(
      const std::vector<std::shared_ptr<metric_t>>& metrics) {
    std::string str;
    for (auto& m : metrics) {
      m->serialize(str);
    }
    return str;
  }